

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

float __thiscall
ImGuiMenuColumns::DeclColumns
          (ImGuiMenuColumns *this,float w_icon,float w_label,float w_shortcut,float w_mark)

{
  ImU16 IVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  bool bVar7;
  ImU16 IVar8;
  
  uVar5 = (ushort)(int)w_icon;
  if ((ushort)(int)w_icon < this->Widths[0]) {
    uVar5 = this->Widths[0];
  }
  this->Widths[0] = uVar5;
  uVar4 = (ushort)*(undefined4 *)(this->Widths + 1);
  uVar5 = (ushort)(int)w_label;
  if ((ushort)(int)w_label < uVar4) {
    uVar5 = uVar4;
  }
  this->Widths[1] = uVar5;
  uVar5 = (ushort)(int)w_shortcut;
  if ((ushort)(int)w_shortcut < this->Widths[2]) {
    uVar5 = this->Widths[2];
  }
  this->Widths[2] = uVar5;
  uVar4 = (ushort)*(undefined4 *)(this->Widths + 3);
  uVar5 = (ushort)(int)w_mark;
  if ((ushort)(int)w_mark < uVar4) {
    uVar5 = uVar4;
  }
  this->Widths[3] = uVar5;
  lVar6 = 9;
  uVar5 = 0;
  bVar7 = false;
  do {
    IVar1 = this->Widths[lVar6 + -9];
    IVar8 = this->Spacing;
    if (IVar1 == 0) {
      IVar8 = 0;
    }
    if (!bVar7) {
      IVar8 = 0;
    }
    bVar7 = (bool)(bVar7 | IVar1 != 0);
    uVar5 = IVar1 + uVar5 + IVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  this->NextTotalWidth = (uint)uVar5;
  uVar2 = this->TotalWidth;
  uVar3 = (uint)uVar5;
  if (uVar5 <= uVar2 && uVar2 != uVar5) {
    uVar3 = uVar2;
  }
  return (float)uVar3;
}

Assistant:

static inline T ImMin(T lhs, T rhs)                        { return lhs < rhs ? lhs : rhs; }